

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_refs_init_key(void)

{
  int iVar1;
  long *plVar2;
  void *pvVar3;
  long *in_FS_OFFSET;
  lddmc_refs_internal_t s;
  
  iVar1 = lace_is_worker();
  if (iVar1 != 0) {
    plVar2 = (long *)malloc(0x48);
    pvVar3 = malloc(0x2000);
    *plVar2 = (long)pvVar3;
    plVar2[2] = (long)pvVar3;
    plVar2[1] = *plVar2 + 0x2000;
    pvVar3 = malloc(0x2000);
    plVar2[3] = (long)pvVar3;
    plVar2[5] = (long)pvVar3;
    plVar2[4] = plVar2[3] + 0x2000;
    pvVar3 = malloc(0x4000);
    plVar2[6] = (long)pvVar3;
    plVar2[8] = (long)pvVar3;
    plVar2[7] = plVar2[6] + 0x4000;
    *(long **)(*in_FS_OFFSET + -0x18) = plVar2;
    return;
  }
  __assert_fail("lace_is_worker()",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                ,0xd1,"void lddmc_refs_init_key(void)");
}

Assistant:

void
lddmc_refs_init_key(void)
{
    assert(lace_is_worker()); // only use inside Lace workers
    lddmc_refs_internal_t s = (lddmc_refs_internal_t)malloc(sizeof(struct lddmc_refs_internal));
    s->pcur = s->pbegin = (const MDD**)malloc(sizeof(MDD*) * 1024);
    s->pend = s->pbegin + 1024;
    s->rcur = s->rbegin = (MDD*)malloc(sizeof(MDD) * 1024);
    s->rend = s->rbegin + 1024;
    s->scur = s->sbegin = (lddmc_refs_task_t)malloc(sizeof(struct lddmc_refs_task) * 1024);
    s->send = s->sbegin + 1024;
    SET_THREAD_LOCAL(lddmc_refs_key, s);
}